

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeBrOnNull<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool onFail)

{
  __index_type *__return_storage_ptr___00;
  Index label_00;
  uint *puVar1;
  bool bVar2;
  Type local_d0;
  Type local_c8;
  uint local_bc;
  Err local_b8;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  Result<unsigned_int> _val;
  Result<unsigned_int> label;
  bool onFail_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20);
  labelidx<wasm::WATParser::ParseDefsCtx>
            ((Result<unsigned_int> *)__return_storage_ptr___00,ctx,false);
  Result<unsigned_int>::Result
            ((Result<unsigned_int> *)local_80,(Result<unsigned_int> *)__return_storage_ptr___00);
  local_98 = Result<unsigned_int>::getErr((Result<unsigned_int> *)local_80);
  bVar2 = local_98 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_b8,local_98);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b8);
    wasm::Err::~Err(&local_b8);
  }
  local_bc = (uint)bVar2;
  Result<unsigned_int>::~Result((Result<unsigned_int> *)local_80);
  if (local_bc == 0) {
    puVar1 = Result<unsigned_int>::operator*
                       ((Result<unsigned_int> *)
                        ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    label_00 = *puVar1;
    wasm::Type::Type(&local_c8,none);
    wasm::Type::Type(&local_d0,none);
    ParseDefsCtx::makeBrOn
              (__return_storage_ptr__,ctx,pos,annotations,label_00,onFail & BrOnNonNull,local_c8,
               local_d0);
    local_bc = 1;
  }
  Result<unsigned_int>::~Result
            ((Result<unsigned_int> *)
             ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeBrOnNull(Ctx& ctx,
                      Index pos,
                      const std::vector<Annotation>& annotations,
                      bool onFail) {
  auto label = labelidx(ctx);
  CHECK_ERR(label);
  return ctx.makeBrOn(
    pos, annotations, *label, onFail ? BrOnNonNull : BrOnNull);
}